

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
mxx::impl::
split<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,impl *this,
          long begin,long *end,long param_5)

{
  int iVar1;
  pointer puVar2;
  ulong uVar3;
  TwoBSA<unsigned_long> *pTVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  pointer puVar10;
  uint uVar11;
  size_type __n;
  unsigned_long uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  pair<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>,___gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>_>
  pVar17;
  allocator_type local_69;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  long local_60;
  long *local_58;
  long local_50;
  ulong local_48;
  TwoBSA<unsigned_long> *local_40;
  value_type_conflict1 local_38;
  
  __n = (size_type)*(int *)(param_5 + 0x10);
  local_68 = __return_storage_ptr__;
  local_60 = begin;
  local_58 = end;
  if ((end[1] - *end) / 0x18 != __n - 1) {
    assert_fail("splitters.size() == (size_t)comm.size() - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                ,0xe9,"split");
    __n = (size_type)*(int *)(param_5 + 0x10);
  }
  local_38 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (local_68,__n,&local_38,&local_69);
  local_48 = (local_60 - (long)this) / 0x18;
  iVar1 = *(int *)(param_5 + 0x10);
  uVar14 = 0;
  local_50 = param_5;
  do {
    lVar9 = *local_58;
    lVar15 = local_58[1];
    if ((ulong)((lVar15 - lVar9) / 0x18) <= uVar14) {
      puVar10 = (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
      puVar10[(long)*(int *)(local_50 + 0x10) + -1] =
           puVar10[(long)*(int *)(local_50 + 0x10) + -1] + (local_60 - (long)this) / 0x18;
      uVar14 = 0;
      for (; puVar10 !=
             (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish; puVar10 = puVar10 + 1) {
        uVar14 = uVar14 + *puVar10;
      }
      if (uVar14 != local_48) {
        assert_fail("std::accumulate(send_counts.begin(), send_counts.end(), 0ull) == local_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                    ,0x114,"split");
      }
      return local_68;
    }
    uVar11 = 1;
    uVar13 = 2;
    local_40 = (TwoBSA<unsigned_long> *)this;
    while( true ) {
      uVar16 = ((int)uVar13 - 1) + uVar14;
      if ((ulong)((lVar15 - lVar9) / 0x18) <= uVar16) break;
      bVar5 = TwoBSA<unsigned_long>::operator<
                        ((TwoBSA<unsigned_long> *)(lVar9 + uVar14 * 0x18),
                         (TwoBSA<unsigned_long> *)(uVar16 * 0x18 + lVar9));
      lVar9 = *local_58;
      if (bVar5) break;
      lVar15 = local_58[1];
      uVar13 = (ulong)((int)uVar13 + 1);
      uVar11 = uVar11 + 1;
    }
    pTVar4 = local_40;
    pVar17 = std::
             __equal_range<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,TwoBSA<unsigned_long>,__gnu_cxx::__ops::_Iter_comp_val<std::less<TwoBSA<unsigned_long>>>,__gnu_cxx::__ops::_Val_comp_iter<std::less<TwoBSA<unsigned_long>>>>
                       (local_40,local_60,lVar9 + uVar14 * 0x18);
    this = (impl *)pVar17.second._M_current;
    puVar2 = (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar10 = puVar2 + uVar14;
    uVar12 = ((long)pVar17.first._M_current._M_current - (long)pTVar4) / 0x18 + *puVar10;
    *puVar10 = uVar12;
    uVar6 = ((long)this - (long)pVar17.first._M_current) / 0x18;
    uVar13 = (uVar6 + uVar12) / uVar13 + 1;
    lVar15 = uVar14 << 0x20;
    for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
      uVar3 = puVar10[uVar14];
      uVar7 = local_48 / (ulong)(long)iVar1 +
              (ulong)((ulong)(lVar15 >> 0x20) < local_48 % (ulong)(long)iVar1);
      uVar8 = uVar7 - uVar3;
      if (uVar7 < uVar3 || uVar8 == 0) {
        uVar8 = 0;
      }
      else {
        if (uVar8 <= uVar13) {
          uVar8 = uVar13;
        }
        if (uVar6 < uVar8) {
          uVar8 = uVar6;
        }
        uVar6 = uVar6 - uVar8;
      }
      puVar10[uVar14] = uVar8 + uVar3;
      lVar15 = lVar15 + 0x100000000;
    }
    puVar2 = puVar2 + uVar16;
    *puVar2 = *puVar2 + uVar6;
    uVar14 = uVar16;
  } while( true );
}

Assistant:

std::vector<size_t> split(_Iterator begin, _Iterator end, _Compare comp, const std::vector<typename std::iterator_traits<_Iterator>::value_type>& splitters, const mxx::comm& comm) {
    // 5. locally find splitter positions in data
    //    (if an identical splitter appears at least three times (or more),
    //    then split the intermediary buckets evenly) => send_counts
    MXX_ASSERT(splitters.size() == (size_t)comm.size() - 1);
    std::vector<size_t> send_counts(comm.size(), 0);
    _Iterator pos = begin;
    size_t local_size = std::distance(begin, end);
    partition::block_decomposition<std::size_t> local_part(local_size, comm.size(), comm.rank());
    for (std::size_t i = 0; i < splitters.size();) {
        // get the number of splitters which are equal starting from `i`
        unsigned int split_by = 1;
        while (i+split_by < splitters.size()
               && !comp(splitters[i], splitters[i+split_by])) {
            ++split_by;
        }

        // get the range of equal elements
        std::pair<_Iterator, _Iterator> eqr = std::equal_range(pos, end, splitters[i], comp);

        // assign smaller elements to processor left of splitter (= `i`)
        send_counts[i] += std::distance(pos, eqr.first);
        pos = eqr.first;

        // split equal elements fairly across processors
        std::size_t eq_size = std::distance(pos, eqr.second);
        // try to split approx equal:
        std::size_t eq_size_split = (eq_size + send_counts[i]) / (split_by+1) + 1;
        for (unsigned int j = 0; j < split_by; ++j) {
            // TODO: this kind of splitting is not `stable` (need other strategy
            // to mak such splitting stable across processors)
            std::size_t out_size = 0;
            if (send_counts[i+j] < local_part.local_size(i+j)) {
                // try to distribute fairly
                out_size = std::min(std::max(local_part.local_size(i+j) - send_counts[i+j], eq_size_split), eq_size);
                eq_size -= out_size;
            }
            send_counts[i+j] += out_size;
        }
        // assign remaining elements to next processor
        send_counts[i+split_by] += eq_size;
        i += split_by;
        pos = eqr.second;
    }
    // send last elements to last processor
    std::size_t out_size = std::distance(pos, end);
    send_counts[comm.size() - 1] += out_size;
    MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), 0ull) == local_size);
    return send_counts;
}